

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vswprint.c
# Opt level: O0

int vswprintf_s(char16_t_conflict *string,size_t sizeInWords,char16_t_conflict *format,
               __va_list_tag *ap)

{
  int iVar1;
  __va_list_tag *ap_local;
  char16_t_conflict *format_local;
  size_t sizeInWords_local;
  char16_t_conflict *string_local;
  
  iVar1 = _vswprintf_s(string,sizeInWords,format,ap);
  return iVar1;
}

Assistant:

int __cdecl _vswprintf_s (
        char16_t *string,
        size_t sizeInWords,
        const char16_t *format,
        va_list ap
        )
{
    int retvalue = -1;

    /* validation section */
    _VALIDATE_RETURN(format != NULL, EINVAL, -1);
    _VALIDATE_RETURN(string != NULL && sizeInWords > 0, EINVAL, -1);

    retvalue = _vswprintf_helper(_woutput_s, string, sizeInWords, format, ap);
    if (retvalue < 0)
    {
        string[0] = 0;
        _SECURECRT__FILL_STRING(string, sizeInWords, 1);
    }
    if (retvalue == -2)
    {
        _VALIDATE_RETURN(("Buffer too small" && 0), ERANGE, -1);
    }
    if (retvalue >= 0)
    {
        _SECURECRT__FILL_STRING(string, sizeInWords, retvalue + 1);
    }

    return retvalue;
}